

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Initialize(SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             *this,int capacity)

{
  code *pcVar1;
  Type TVar2;
  int *piVar3;
  EntryType *pEVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  int size;
  Type local_50;
  int *newBuckets;
  EntryType *newEntries;
  WeakType *newWeakRefs;
  int modIndex;
  
  size = 4;
  if (4 < capacity) {
    size = capacity;
  }
  newWeakRefs._0_4_ = 0x4b;
  uVar6 = size + 1U >> 1;
  if (capacity < 9) {
    uVar6 = 4;
  }
  uVar6 = PrimePolicy::GetPrime(uVar6,(int *)&newWeakRefs);
  if (uVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x1b3,"(initBucketCount > 0)",
                       "Size returned by policy should be greater than 0");
    if (!bVar5) goto LAB_00d26ea6;
    *puVar7 = 0;
  }
  local_50.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  newEntries = (EntryType *)0x0;
  Allocate(this,&local_50.ptr,(EntryType **)&newBuckets,(WeakType **)&newEntries,uVar6,size);
  TVar2.ptr = local_50.ptr;
  newWeakRefs._4_4_ = uVar6;
  Memory::Recycler::WBSetBit((char *)&this->buckets);
  (this->buckets).ptr = TVar2.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
  piVar3 = newBuckets;
  Memory::Recycler::WBSetBit((char *)&this->entries);
  (this->entries).ptr =
       (ValueEntry<bool,_JsUtil::(anonymous_namespace)::ValueEntryData<bool>_> *)piVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
  pEVar4 = newEntries;
  Memory::Recycler::WBSetBit((char *)&this->weakRefs);
  (this->weakRefs).ptr = (RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*> *)pEVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->weakRefs);
  this->bucketCount = newWeakRefs._4_4_;
  this->size = size;
  this->modFunctionIndex = (Type)newWeakRefs;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x1c1,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar5) {
LAB_00d26ea6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            Allocate(&newBuckets, &newEntries, &newWeakRefs, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
        }